

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gnode_before.c
# Opt level: O1

mpt_node * mpt_gnode_before(mpt_node *position,mpt_node *insert)

{
  mpt_node *pmVar1;
  int *piVar2;
  
  if (insert == (mpt_node *)0x0) {
    piVar2 = __errno_location();
    *piVar2 = 0xe;
    return (mpt_node *)0x0;
  }
  if (insert != position && position != (mpt_node *)0x0) {
    insert->prev = position->prev;
    insert->next = position;
    position->prev = insert;
    pmVar1 = position->parent;
    insert->parent = pmVar1;
    if (insert->prev != (mpt_node *)0x0) {
      insert->prev->next = insert;
      return insert;
    }
    if (pmVar1 != (mpt_node *)0x0) {
      pmVar1->children = insert;
      return insert;
    }
  }
  return insert;
}

Assistant:

extern MPT_STRUCT(node) *mpt_gnode_before(MPT_STRUCT(node) *position, MPT_STRUCT(node) *insert)
{
	if ( !insert ) {
		errno = EFAULT; return 0;
	}
	
	/* no previous node, avoid self-reference */
	if ( !position || insert == position )
		return insert;
	
	/* avoid self-reference */
	insert->prev = position->prev;
	insert->next = position;
	position->prev = insert;
	
	insert->parent = position->parent;
	
	if ( (position = insert->prev) )
		position->next = insert;
	else if ( (position = insert->parent) )
		position->children = insert;
	
	/* return inserted node */
	return insert;
}